

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
      *this)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  
  pFVar1 = (this->left_->fadexpr_).right_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  return (((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_ *
          ((pFVar3->fadexpr_).right_)->val_ * ((pFVar2->fadexpr_).right_)->val_ +
         (this->right_->fadexpr_).left_.constant_) *
         ((this->left_->fadexpr_).left_.constant_ -
         ((pFVar1->fadexpr_).left_)->val_ * ((pFVar1->fadexpr_).right_)->val_);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}